

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

Cec3_Man_t * Cec3_ManCreate(Gia_Man_t *pAig,Cec3_Par_t *pPars)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Cec3_Man_t *pCVar6;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar7;
  int *piVar8;
  bmcg_sat_solver *pbVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  Vec_Int_t *pVVar12;
  abctime aVar13;
  long lVar14;
  timespec ts;
  timespec local_40;
  
  pCVar6 = (Cec3_Man_t *)calloc(1,0xa0);
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    aVar13 = -1;
  }
  else {
    aVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pCVar6->timeStart = aVar13;
  pCVar6->pPars = pPars;
  pCVar6->pAig = pAig;
  p = Gia_ManStart(pAig->nObjs);
  pCVar6->pNew = p;
  Gia_ManFillValue(pAig);
  pAig->pObjs->Value = 0;
  pVVar12 = pAig->vCis;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar5 = pVVar12->pArray[lVar14];
      if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pAig->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p->nObjs <= pGVar7)) {
LAB_0065bf4d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar7 < pGVar4) || (pGVar4 + p->nObjs <= pGVar7)) goto LAB_0065bf4d;
      pGVar2[iVar5].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar12 = pAig->vCis;
    } while (lVar14 < pVVar12->nSize);
  }
  Gia_ManHashAlloc(p);
  uVar1 = p->nObjs;
  if ((p->vCopies2).nCap < (int)uVar1) {
    piVar8 = (p->vCopies2).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vCopies2).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies2).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies2).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vCopies2).nSize = uVar1;
  pbVar9 = bmcg_sat_solver_start();
  pCVar6->pSat = pbVar9;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(8000);
  pVVar10->pArray = ppvVar11;
  pCVar6->vFrontier = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(800);
  pVVar10->pArray = ppvVar11;
  pCVar6->vFanins = pVVar10;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar12->pArray = piVar8;
  pCVar6->vNodesNew = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar12->pArray = piVar8;
  pCVar6->vSatVars = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar12->pArray = piVar8;
  pCVar6->vObjSatPairs = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar12->pArray = piVar8;
  pCVar6->vCexTriples = pVVar12;
  pAig->pData = pbVar9;
  return pCVar6;
}

Assistant:

Cec3_Man_t * Cec3_ManCreate( Gia_Man_t * pAig, Cec3_Par_t * pPars )
{
    Cec3_Man_t * p;
    Gia_Obj_t * pObj; int i;
    //satoko_opts_t Pars;
    //assert( Gia_ManRegNum(pAig) == 0 );
    p = ABC_CALLOC( Cec3_Man_t, 1 );
    memset( p, 0, sizeof(Cec3_Man_t) );
    p->timeStart    = Abc_Clock();
    p->pPars        = pPars;
    p->pAig         = pAig;
    // create new manager
    p->pNew         = Gia_ManStart( Gia_ManObjNum(pAig) );
    Gia_ManFillValue( pAig );
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_ManAppendCi( p->pNew );
    Gia_ManHashAlloc( p->pNew );
    Vec_IntFill( &p->pNew->vCopies2, Gia_ManObjNum(p->pNew), -1 );
    // SAT solving
    //memset( &Pars, 0, sizeof(satoko_opts_t) );
    p->pSat         = bmcg_sat_solver_start();
    p->vFrontier    = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vNodesNew    = Vec_IntAlloc( 100 );
    p->vSatVars     = Vec_IntAlloc( 100 );
    p->vObjSatPairs = Vec_IntAlloc( 100 );
    p->vCexTriples  = Vec_IntAlloc( 100 );
    //Pars.conf_limit = pPars->nConfLimit;
    //satoko_configure(p->pSat, &Pars);
    // remember pointer to the solver in the AIG manager
    pAig->pData     = p->pSat;
    return p;
}